

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O2

int __thiscall CVmPackPos::parse_int(CVmPackPos *this)

{
  uint uVar1;
  wchar_t wVar2;
  int iVar3;
  
  uVar1 = this->idx;
  iVar3 = 0;
  while( true ) {
    wVar2 = getch(this);
    if (9 < (uint)(wVar2 + L'\xffffffd0')) {
      return iVar3;
    }
    iVar3 = wVar2 + L'\xffffffd0' + iVar3 * 10;
    if (iVar3 < 0) break;
    inc(this);
  }
  err_throw_a(0x6b,1,0,(ulong)uVar1);
}

Assistant:

int parse_int()
    {
        /* remember the starting location, for error reporting */
        int start_idx = idx;

        /* parse digits until we find something else */
        int acc;
        wchar_t c;
        for (acc = 0 ; is_digit(c = getch()) ; inc())
        {
            /* add the digit into the accumulator */
            acc *= 10;
            acc += value_of_digit(c);

            /* if this overflows an int, it's an error */
            if (acc < 0)
                err_throw_a(VMERR_PACK_PARSE, 1, ERR_TYPE_INT, start_idx);
        }

        /* return the result */
        return acc;
    }